

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O2

void inproc_ep_init(inproc_ep *ep,nni_sock *sock,nng_url *url)

{
  uint16_t uVar1;
  
  nni_mtx_init(&ep->mtx);
  uVar1 = nni_sock_proto_id(sock);
  ep->proto = uVar1;
  ep->rcvmax = 0;
  nni_list_init_offset(&ep->clients,0x18);
  nni_aio_list_init(&ep->aios);
  ep->addr = url->u_path;
  return;
}

Assistant:

static void
inproc_ep_init(inproc_ep *ep, nni_sock *sock, const nng_url *url)
{
	nni_mtx_init(&ep->mtx);
	ep->proto  = nni_sock_proto_id(sock);
	ep->rcvmax = 0;
	NNI_LIST_INIT(&ep->clients, inproc_ep, node);
	nni_aio_list_init(&ep->aios);
	ep->addr = url->u_path; // we match on the URL path.
}